

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::SwapElements
          (RepeatedFieldWrapper<long> *this,Field *data,int index1,int index2)

{
  RepeatedField<long> *this_00;
  
  this_00 = (RepeatedField<long> *)(**(code **)(*(long *)this + 0x88))();
  RepeatedField<long>::SwapElements(this_00,index1,index2);
  return;
}

Assistant:

void SwapElements(Field* data, int index1, int index2) const override {
    MutableRepeatedField(data)->SwapElements(index1, index2);
  }